

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

bool __thiscall cs::structure::operator==(structure *this,structure *s)

{
  domain_type *this_00;
  element_type *peVar1;
  char *pcVar2;
  any aVar3;
  baseHolder *pbVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [11];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [13];
  undefined1 auVar18 [13];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  int iVar21;
  size_t sVar22;
  var *pvVar23;
  bool *pbVar24;
  uint uVar25;
  char *pcVar26;
  value_type *it;
  slot_type *name;
  bool bVar27;
  byte bVar28;
  char cVar29;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  any aStack_98;
  any local_90;
  any local_88;
  string local_80;
  structure *local_60;
  structure *local_58;
  key_arg<std::__cxx11::basic_string<char>_> local_50;
  
  if (this != s) {
    sVar22 = (s->m_id).type_hash;
    if (sVar22 == 0) {
      bVar27 = std::type_index::operator==(&(s->m_id).type_idx,&(this->m_id).type_idx);
    }
    else {
      bVar27 = sVar22 == (this->m_id).type_hash;
    }
    if (bVar27 == false) {
      bVar28 = 0;
      goto LAB_00179a2c;
    }
  }
  if (this->m_shadow == false) {
    peVar1 = (this->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"equal","");
    sVar22 = phmap::priv::
             raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
             ::count<std::__cxx11::string>
                       ((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                         *)peVar1,&local_50);
    bVar27 = sVar22 != 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar27 = false;
  }
  if (bVar27) {
    this_00 = (this->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"equal","");
    pvVar23 = domain_type::get_var(this_00,&local_80);
    local_58 = this;
    cs_impl::any::make<cs::structure,cs::structure_const*>(&local_90,&local_58);
    local_60 = s;
    cs_impl::any::make<cs::structure,cs::structure_const*>(&aStack_98,&local_60);
    invoke<cs_impl::any,cs_impl::any>((cs *)&local_88,pvVar23,&local_90,&aStack_98);
    pbVar24 = cs_impl::any::const_val<bool>(&local_88);
    bVar28 = *pbVar24;
    cs_impl::any::recycle(&local_88);
    cs_impl::any::recycle(&aStack_98);
    cs_impl::any::recycle(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    peVar1 = (this->m_data).super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar2 = (peVar1->m_reflect).
             super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .
             super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .ctrl_;
    name = (peVar1->m_reflect).
           super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           .
           super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           .slots_;
    cVar29 = *pcVar2;
    pcVar26 = pcVar2;
    while (cVar29 < -1) {
      iVar21 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                      CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar10 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                      CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar11 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                      CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar12 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar26 < (char)iVar21);
      in_XMM1_Bb = -(pcVar26[1] < (char)((uint)iVar21 >> 8));
      in_XMM1_Bc = -(pcVar26[2] < (char)((uint)iVar21 >> 0x10));
      in_XMM1_Bd = -(pcVar26[3] < (char)((uint)iVar21 >> 0x18));
      in_XMM1_Be = -(pcVar26[4] < (char)iVar10);
      in_XMM1_Bf = -(pcVar26[5] < (char)((uint)iVar10 >> 8));
      in_XMM1_Bg = -(pcVar26[6] < (char)((uint)iVar10 >> 0x10));
      in_XMM1_Bh = -(pcVar26[7] < (char)((uint)iVar10 >> 0x18));
      in_XMM1_Bi = -(pcVar26[8] < (char)iVar11);
      in_XMM1_Bj = -(pcVar26[9] < (char)((uint)iVar11 >> 8));
      in_XMM1_Bk = -(pcVar26[10] < (char)((uint)iVar11 >> 0x10));
      in_XMM1_Bl = -(pcVar26[0xb] < (char)((uint)iVar11 >> 0x18));
      in_XMM1_Bm = -(pcVar26[0xc] < (char)iVar12);
      in_XMM1_Bn = -(pcVar26[0xd] < (char)((uint)iVar12 >> 8));
      in_XMM1_Bo = -(pcVar26[0xe] < (char)((uint)iVar12 >> 0x10));
      in_XMM1_Bp = -(pcVar26[0xf] < (char)((uint)iVar12 >> 0x18));
      auVar6[1] = in_XMM1_Bb;
      auVar6[0] = in_XMM1_Ba;
      auVar6[2] = in_XMM1_Bc;
      auVar6[3] = in_XMM1_Bd;
      auVar6[4] = in_XMM1_Be;
      auVar6[5] = in_XMM1_Bf;
      auVar6[6] = in_XMM1_Bg;
      auVar6[7] = in_XMM1_Bh;
      auVar6[8] = in_XMM1_Bi;
      auVar6[9] = in_XMM1_Bj;
      auVar6[10] = in_XMM1_Bk;
      auVar6[0xb] = in_XMM1_Bl;
      auVar6[0xc] = in_XMM1_Bm;
      auVar6[0xd] = in_XMM1_Bn;
      auVar6[0xe] = in_XMM1_Bo;
      auVar6[0xf] = in_XMM1_Bp;
      auVar7[1] = in_XMM1_Bb;
      auVar7[0] = in_XMM1_Ba;
      auVar7[2] = in_XMM1_Bc;
      auVar7[3] = in_XMM1_Bd;
      auVar7[4] = in_XMM1_Be;
      auVar7[5] = in_XMM1_Bf;
      auVar7[6] = in_XMM1_Bg;
      auVar7[7] = in_XMM1_Bh;
      auVar7[8] = in_XMM1_Bi;
      auVar7[9] = in_XMM1_Bj;
      auVar7[10] = in_XMM1_Bk;
      auVar7[0xb] = in_XMM1_Bl;
      auVar7[0xc] = in_XMM1_Bm;
      auVar7[0xd] = in_XMM1_Bn;
      auVar7[0xe] = in_XMM1_Bo;
      auVar7[0xf] = in_XMM1_Bp;
      auVar19[1] = in_XMM1_Bd;
      auVar19[0] = in_XMM1_Bc;
      auVar19[2] = in_XMM1_Be;
      auVar19[3] = in_XMM1_Bf;
      auVar19[4] = in_XMM1_Bg;
      auVar19[5] = in_XMM1_Bh;
      auVar19[6] = in_XMM1_Bi;
      auVar19[7] = in_XMM1_Bj;
      auVar19[8] = in_XMM1_Bk;
      auVar19[9] = in_XMM1_Bl;
      auVar19[10] = in_XMM1_Bm;
      auVar19[0xb] = in_XMM1_Bn;
      auVar19[0xc] = in_XMM1_Bo;
      auVar19[0xd] = in_XMM1_Bp;
      auVar17[1] = in_XMM1_Be;
      auVar17[0] = in_XMM1_Bd;
      auVar17[2] = in_XMM1_Bf;
      auVar17[3] = in_XMM1_Bg;
      auVar17[4] = in_XMM1_Bh;
      auVar17[5] = in_XMM1_Bi;
      auVar17[6] = in_XMM1_Bj;
      auVar17[7] = in_XMM1_Bk;
      auVar17[8] = in_XMM1_Bl;
      auVar17[9] = in_XMM1_Bm;
      auVar17[10] = in_XMM1_Bn;
      auVar17[0xb] = in_XMM1_Bo;
      auVar17[0xc] = in_XMM1_Bp;
      auVar15[1] = in_XMM1_Bf;
      auVar15[0] = in_XMM1_Be;
      auVar15[2] = in_XMM1_Bg;
      auVar15[3] = in_XMM1_Bh;
      auVar15[4] = in_XMM1_Bi;
      auVar15[5] = in_XMM1_Bj;
      auVar15[6] = in_XMM1_Bk;
      auVar15[7] = in_XMM1_Bl;
      auVar15[8] = in_XMM1_Bm;
      auVar15[9] = in_XMM1_Bn;
      auVar15[10] = in_XMM1_Bo;
      auVar15[0xb] = in_XMM1_Bp;
      auVar13[1] = in_XMM1_Bg;
      auVar13[0] = in_XMM1_Bf;
      auVar13[2] = in_XMM1_Bh;
      auVar13[3] = in_XMM1_Bi;
      auVar13[4] = in_XMM1_Bj;
      auVar13[5] = in_XMM1_Bk;
      auVar13[6] = in_XMM1_Bl;
      auVar13[7] = in_XMM1_Bm;
      auVar13[8] = in_XMM1_Bn;
      auVar13[9] = in_XMM1_Bo;
      auVar13[10] = in_XMM1_Bp;
      uVar25 = (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar19 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar17 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar15 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar13 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar5 = 0;
      if (uVar25 != 0) {
        for (; (uVar25 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      name = name + uVar5;
      cVar29 = pcVar26[uVar5];
      pcVar26 = pcVar26 + uVar5;
    }
    sVar22 = (peVar1->m_reflect).
             super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .
             super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             .capacity_;
    while (bVar28 = pcVar26 == pcVar2 + sVar22, !(bool)bVar28) {
      iVar21 = std::__cxx11::string::compare((char *)name);
      if (iVar21 != 0) {
        pvVar23 = domain_type::get_var
                            ((s->m_data).
                             super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             &(name->value).first);
        aVar3.mDat = (((this->m_data).
                       super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     m_slot).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl
                     .super__Vector_impl_data._M_start[(long)(&name->key)[1]._M_dataplus._M_p].mDat;
        cVar29 = aVar3.mDat == (proxy *)0x0;
        if (pvVar23->mDat != (proxy *)0x0) {
          if (aVar3.mDat == (proxy *)0x0) break;
          pbVar4 = pvVar23->mDat->data;
          iVar21 = (*pbVar4->_vptr_baseHolder[4])(pbVar4,(aVar3.mDat)->data);
          cVar29 = (char)iVar21;
        }
        if (cVar29 == '\0') break;
      }
      name = (slot_type *)&(&name->key)[1]._M_string_length;
      cVar29 = pcVar26[1];
      pcVar26 = pcVar26 + 1;
      while (cVar29 < -1) {
        iVar21 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        == CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        );
        iVar10 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        == CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        );
        iVar11 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        == CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        );
        iVar12 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        == CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        );
        in_XMM1_Ba = -(*pcVar26 < (char)iVar21);
        in_XMM1_Bb = -(pcVar26[1] < (char)((uint)iVar21 >> 8));
        in_XMM1_Bc = -(pcVar26[2] < (char)((uint)iVar21 >> 0x10));
        in_XMM1_Bd = -(pcVar26[3] < (char)((uint)iVar21 >> 0x18));
        in_XMM1_Be = -(pcVar26[4] < (char)iVar10);
        in_XMM1_Bf = -(pcVar26[5] < (char)((uint)iVar10 >> 8));
        in_XMM1_Bg = -(pcVar26[6] < (char)((uint)iVar10 >> 0x10));
        in_XMM1_Bh = -(pcVar26[7] < (char)((uint)iVar10 >> 0x18));
        in_XMM1_Bi = -(pcVar26[8] < (char)iVar11);
        in_XMM1_Bj = -(pcVar26[9] < (char)((uint)iVar11 >> 8));
        in_XMM1_Bk = -(pcVar26[10] < (char)((uint)iVar11 >> 0x10));
        in_XMM1_Bl = -(pcVar26[0xb] < (char)((uint)iVar11 >> 0x18));
        in_XMM1_Bm = -(pcVar26[0xc] < (char)iVar12);
        in_XMM1_Bn = -(pcVar26[0xd] < (char)((uint)iVar12 >> 8));
        in_XMM1_Bo = -(pcVar26[0xe] < (char)((uint)iVar12 >> 0x10));
        in_XMM1_Bp = -(pcVar26[0xf] < (char)((uint)iVar12 >> 0x18));
        auVar8[1] = in_XMM1_Bb;
        auVar8[0] = in_XMM1_Ba;
        auVar8[2] = in_XMM1_Bc;
        auVar8[3] = in_XMM1_Bd;
        auVar8[4] = in_XMM1_Be;
        auVar8[5] = in_XMM1_Bf;
        auVar8[6] = in_XMM1_Bg;
        auVar8[7] = in_XMM1_Bh;
        auVar8[8] = in_XMM1_Bi;
        auVar8[9] = in_XMM1_Bj;
        auVar8[10] = in_XMM1_Bk;
        auVar8[0xb] = in_XMM1_Bl;
        auVar8[0xc] = in_XMM1_Bm;
        auVar8[0xd] = in_XMM1_Bn;
        auVar8[0xe] = in_XMM1_Bo;
        auVar8[0xf] = in_XMM1_Bp;
        auVar9[1] = in_XMM1_Bb;
        auVar9[0] = in_XMM1_Ba;
        auVar9[2] = in_XMM1_Bc;
        auVar9[3] = in_XMM1_Bd;
        auVar9[4] = in_XMM1_Be;
        auVar9[5] = in_XMM1_Bf;
        auVar9[6] = in_XMM1_Bg;
        auVar9[7] = in_XMM1_Bh;
        auVar9[8] = in_XMM1_Bi;
        auVar9[9] = in_XMM1_Bj;
        auVar9[10] = in_XMM1_Bk;
        auVar9[0xb] = in_XMM1_Bl;
        auVar9[0xc] = in_XMM1_Bm;
        auVar9[0xd] = in_XMM1_Bn;
        auVar9[0xe] = in_XMM1_Bo;
        auVar9[0xf] = in_XMM1_Bp;
        auVar20[1] = in_XMM1_Bd;
        auVar20[0] = in_XMM1_Bc;
        auVar20[2] = in_XMM1_Be;
        auVar20[3] = in_XMM1_Bf;
        auVar20[4] = in_XMM1_Bg;
        auVar20[5] = in_XMM1_Bh;
        auVar20[6] = in_XMM1_Bi;
        auVar20[7] = in_XMM1_Bj;
        auVar20[8] = in_XMM1_Bk;
        auVar20[9] = in_XMM1_Bl;
        auVar20[10] = in_XMM1_Bm;
        auVar20[0xb] = in_XMM1_Bn;
        auVar20[0xc] = in_XMM1_Bo;
        auVar20[0xd] = in_XMM1_Bp;
        auVar18[1] = in_XMM1_Be;
        auVar18[0] = in_XMM1_Bd;
        auVar18[2] = in_XMM1_Bf;
        auVar18[3] = in_XMM1_Bg;
        auVar18[4] = in_XMM1_Bh;
        auVar18[5] = in_XMM1_Bi;
        auVar18[6] = in_XMM1_Bj;
        auVar18[7] = in_XMM1_Bk;
        auVar18[8] = in_XMM1_Bl;
        auVar18[9] = in_XMM1_Bm;
        auVar18[10] = in_XMM1_Bn;
        auVar18[0xb] = in_XMM1_Bo;
        auVar18[0xc] = in_XMM1_Bp;
        auVar16[1] = in_XMM1_Bf;
        auVar16[0] = in_XMM1_Be;
        auVar16[2] = in_XMM1_Bg;
        auVar16[3] = in_XMM1_Bh;
        auVar16[4] = in_XMM1_Bi;
        auVar16[5] = in_XMM1_Bj;
        auVar16[6] = in_XMM1_Bk;
        auVar16[7] = in_XMM1_Bl;
        auVar16[8] = in_XMM1_Bm;
        auVar16[9] = in_XMM1_Bn;
        auVar16[10] = in_XMM1_Bo;
        auVar16[0xb] = in_XMM1_Bp;
        auVar14[1] = in_XMM1_Bg;
        auVar14[0] = in_XMM1_Bf;
        auVar14[2] = in_XMM1_Bh;
        auVar14[3] = in_XMM1_Bi;
        auVar14[4] = in_XMM1_Bj;
        auVar14[5] = in_XMM1_Bk;
        auVar14[6] = in_XMM1_Bl;
        auVar14[7] = in_XMM1_Bm;
        auVar14[8] = in_XMM1_Bn;
        auVar14[9] = in_XMM1_Bo;
        auVar14[10] = in_XMM1_Bp;
        uVar25 = (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar20 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar18 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar16 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar14 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar5 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        name = name + uVar5;
        cVar29 = pcVar26[uVar5];
        pcVar26 = pcVar26 + uVar5;
      }
    }
  }
LAB_00179a2c:
  return (bool)(bVar28 & 1);
}

Assistant:

bool operator==(const structure &s) const
		{
			if (s.m_id != m_id)
				return false;
			if (!m_shadow && m_data->exist("equal"))
				return invoke(m_data->get_var("equal"), var::make<structure>(this),
				              var::make<structure>(&s)).const_val<bool>();
			else {
				for (auto &it: *m_data)
					if (it.first != "parent" && s.m_data->get_var(it.first) != m_data->get_var_by_id(it.second))
						return false;
				return true;
			}
		}